

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O2

void __thiscall
QHeaderView::paintSection(QHeaderView *this,QPainter *painter,QRect *rect,int logicalIndex)

{
  QPalette *this_00;
  long lVar1;
  bool bVar2;
  QBrush *pQVar3;
  QStyle *pQVar4;
  long in_FS_OFFSET;
  QPoint local_f8;
  QBrush nBrushWindow;
  QBrush nBrushButton;
  QBrush oBrushWindow;
  QBrush oBrushButton;
  QStyleOptionHeaderV2 opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((rect->x2).m_i < (rect->x1).m_i) || ((rect->y2).m_i < (rect->y1).m_i)) goto LAB_004fc6de;
  memset(&opt,0xaa,0x88);
  QStyleOptionHeaderV2::QStyleOptionHeaderV2(&opt);
  QPainter::brushOrigin();
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x318))(this,&opt);
  _oBrushButton = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = &opt.super_QStyleOptionHeader.super_QStyleOption.palette;
  pQVar3 = QPalette::brush(this_00,Button);
  QBrush::QBrush(&oBrushButton,pQVar3);
  _oBrushWindow = &DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = QPalette::brush(this_00,Window);
  QBrush::QBrush(&oBrushWindow,pQVar3);
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x310))(this,&opt,logicalIndex);
  opt.super_QStyleOptionHeader.super_QStyleOption.rect.x1.m_i = (rect->x1).m_i;
  opt.super_QStyleOptionHeader.super_QStyleOption.rect.y1.m_i = (rect->y1).m_i;
  opt.super_QStyleOptionHeader.super_QStyleOption.rect.x2.m_i = (rect->x2).m_i;
  opt.super_QStyleOptionHeader.super_QStyleOption.rect.y2.m_i = (rect->y2).m_i;
  _nBrushButton = &DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = QPalette::brush(this_00,Button);
  QBrush::QBrush(&nBrushButton,pQVar3);
  _nBrushWindow = &DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = QPalette::brush(this_00,Window);
  QBrush::QBrush(&nBrushWindow,pQVar3);
  bVar2 = QBrush::operator!=(&oBrushButton,&nBrushButton);
  if (bVar2) {
LAB_004fc666:
    local_f8.xp.m_i = opt.super_QStyleOptionHeader.super_QStyleOption.rect.x1.m_i;
    local_f8.yp.m_i = opt.super_QStyleOptionHeader.super_QStyleOption.rect.y1.m_i;
    QPainter::setBrushOrigin(painter,&local_f8);
  }
  else {
    bVar2 = QBrush::operator!=(&oBrushWindow,&nBrushWindow);
    if (bVar2) goto LAB_004fc666;
  }
  pQVar4 = QWidget::style((QWidget *)this);
  (**(code **)(*(long *)pQVar4 + 0xb8))(pQVar4,0x17,&opt.super_QStyleOptionHeader,painter,this);
  QPainter::setBrushOrigin((QPointF *)painter);
  QBrush::~QBrush(&nBrushWindow);
  QBrush::~QBrush(&nBrushButton);
  QBrush::~QBrush(&oBrushWindow);
  QBrush::~QBrush(&oBrushButton);
  QStyleOptionHeader::~QStyleOptionHeader(&opt.super_QStyleOptionHeader);
LAB_004fc6de:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHeaderView::paintSection(QPainter *painter, const QRect &rect, int logicalIndex) const
{
    if (!rect.isValid())
        return;

    QStyleOptionHeaderV2 opt;
    QPointF oldBO = painter->brushOrigin();

    initStyleOption(&opt);

    QBrush oBrushButton = opt.palette.brush(QPalette::Button);
    QBrush oBrushWindow = opt.palette.brush(QPalette::Window);

    initStyleOptionForIndex(&opt, logicalIndex);
    // We set rect here. If it needs to be changed it can be changed by overriding this function
    opt.rect = rect;

    QBrush nBrushButton = opt.palette.brush(QPalette::Button);
    QBrush nBrushWindow = opt.palette.brush(QPalette::Window);

    // If relevant brushes are not the same as from the regular widgets we set the brush origin
    if (oBrushButton != nBrushButton || oBrushWindow != nBrushWindow) {
        painter->setBrushOrigin(opt.rect.topLeft());
    }

    // draw the section.
    style()->drawControl(QStyle::CE_Header, &opt, painter, this);
    painter->setBrushOrigin(oldBO);
}